

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void daily_example(void)

{
  shared_ptr<spdlog::logger> daily_logger;
  allocator local_69;
  string local_68 [47];
  undefined1 in_stack_ffffffffffffffc7;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  filename_t *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  uint16_t in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"daily_logger",(allocator *)&stack0xffffffffffffffcf
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"logs/daily.txt",&local_69);
  spdlog::daily_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7,in_stack_fffffffffffffff0);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x10dff4);
  return;
}

Assistant:

void daily_example()
{
    // Create a daily logger - a new file is created every day on 2:30am.
    auto daily_logger = spdlog::daily_logger_mt("daily_logger", "logs/daily.txt", 2, 30);
}